

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GLSL420Pack::InitializerListTest::getTypeDefinition_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListTest *this)

{
  reference pvVar1;
  TestError *this_00;
  testCase *test_case;
  InitializerListTest *this_local;
  string *type_definition;
  
  pvVar1 = std::
           vector<gl4cts::GLSL420Pack::InitializerListTest::testCase,_std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>_>
           ::operator[](&this->m_test_cases,(long)this->m_current_test_case_index);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch(pvVar1->m_initializer) {
  case VECTOR:
  case MATRIX:
  case MATRIX_ROWS:
  case ARRAY_SCALAR:
  case ARRAY_VECTOR_CTR:
  case ARRAY_VECTOR_LIST:
  case ARRAY_MATRIX_CTR:
  case ARRAY_MATRIX_LIST:
  case UNSIZED_ARRAY_SCALAR:
  case UNSIZED_ARRAY_VECTOR:
  case UNSIZED_ARRAY_MATRIX:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"");
    break;
  case STRUCT:
  case ARRAY_STRUCT:
  case UNSIZED_ARRAY_STRUCT:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,getTypeDefinition::basic_struct);
    break;
  case NESTED_STRUCT_CTR:
  case NESTED_STRUCT_LIST:
  case NESTED_ARRAY_STRUCT_STRUCT_LIST:
  case NESTED_ARRAY_STRUCT_STRUCT_MIX:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,getTypeDefinition::basic_struct);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case NESTED_STURCT_ARRAYS_STRUCT_LIST:
  case NESTED_STURCT_ARRAYS_STRUCT_MIX:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,getTypeDefinition::basic_struct);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case NESTED_STRUCT_STRUCT_ARRAY_LIST:
  case NESTED_STRUCT_STRUCT_ARRAY_MIX:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,getTypeDefinition::struct_with_array);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x3838);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InitializerListTest::getTypeDefinition()
{
	const testCase& test_case = m_test_cases[m_current_test_case_index];

	static const GLchar* basic_struct = "struct BasicStructure {\n"
										"    vec4 member_a;\n"
										"    vec4 member_b;\n"
										"};\n";

	static const GLchar* struct_with_array = "struct StructureWithArray {\n"
											 "    vec4 member_a;\n"
											 "    vec4 member_b[2];\n"
											 "};\n";

	static const GLchar* struct_with_struct = "struct StructureWithStructure {\n"
											  "    BasicStructure member_a;\n"
											  "    vec4           member_b;\n"
											  "};\n";

	static const GLchar* struct_with_struct_array = "struct StructureWithStructArray {\n"
													"    vec4           member_a;\n"
													"    BasicStructure member_b[3];\n"
													"};\n";

	static const GLchar* struct_with_struct_with_array = "struct StructureWithStructureWithArray {\n"
														 "    StructureWithArray member_a;\n"
														 "    vec4               member_b;\n"
														 "};\n";

	std::string type_definition;

	switch (test_case.m_initializer)
	{
	case VECTOR:
	case MATRIX:
	case MATRIX_ROWS:
	case ARRAY_SCALAR:
	case ARRAY_VECTOR_CTR:
	case ARRAY_VECTOR_LIST:
	case ARRAY_MATRIX_CTR:
	case ARRAY_MATRIX_LIST:
	case UNSIZED_ARRAY_SCALAR:
	case UNSIZED_ARRAY_VECTOR:
	case UNSIZED_ARRAY_MATRIX:
		type_definition = "";
		break;
	case STRUCT:
	case ARRAY_STRUCT:
	case UNSIZED_ARRAY_STRUCT:
		type_definition = basic_struct;
		break;
	case NESTED_STRUCT_CTR:
	case NESTED_STRUCT_LIST:
	case NESTED_ARRAY_STRUCT_STRUCT_LIST:
	case NESTED_ARRAY_STRUCT_STRUCT_MIX:
		type_definition = basic_struct;
		type_definition.append(struct_with_struct);
		break;
	case NESTED_STURCT_ARRAYS_STRUCT_LIST:
	case NESTED_STURCT_ARRAYS_STRUCT_MIX:
		type_definition = basic_struct;
		type_definition.append(struct_with_struct_array);
		break;
	case NESTED_STRUCT_STRUCT_ARRAY_LIST:
	case NESTED_STRUCT_STRUCT_ARRAY_MIX:
		type_definition = struct_with_array;
		type_definition.append(struct_with_struct_with_array);
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	return type_definition;
}